

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<int,_int,_int,_int,_int,_int>,_testing::internal::CastAndAppendTransform<const_unsigned_int_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>_>
::IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int>,_5UL>::operator()
          (void *param_1,undefined8 param_2,
          vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
          *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  bVar1;
  value_type *__value;
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  *in_stack_ffffffffffffffa0;
  CastAndAppendTransform<const_unsigned_int_&> *in_stack_ffffffffffffffa8;
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  local_48;
  value_type local_40;
  undefined8 local_28;
  void *local_20;
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  local_18 [3];
  
  local_28 = param_2;
  local_20 = param_1;
  local_18[0].container = param_3;
  std::get<1ul,int,int,int,int,int,int>((tuple<int,_int,_int,_int,_int,_int> *)0x9c684d);
  __value = &local_40;
  CastAndAppendTransform<unsigned_int_const&>::operator()
            (in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
  local_48 = std::
             back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
             ::operator++(local_18,0);
  std::
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  ::operator*(&local_48);
  std::
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  ::operator=(in_stack_ffffffffffffffa0,__value);
  Matcher<const_unsigned_int_&>::~Matcher((Matcher<const_unsigned_int_&> *)0x9c6896);
  bVar1 = IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int>,_4UL>::operator()
                    ((IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int>,_4UL> *)
                     &stack0xffffffffffffffab,local_28,local_18[0].container);
  return (back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }